

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::makeCompositeDebugType
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *memberTypes,char *name
          ,NonSemanticShaderDebugInfo100DebugCompositeType tag,bool isOpaqueType)

{
  Builder *this_00;
  uint memberType_00;
  Id IVar1;
  iterator iVar2;
  mapped_type_conflict *pmVar3;
  mapped_type *debugTypeLoc;
  Instruction *this_01;
  mapped_type *this_02;
  Id IVar4;
  pointer puVar5;
  byte bVar6;
  undefined3 in_register_00000081;
  pointer puVar7;
  allocator<char> local_b1;
  Instruction *type;
  NonSemanticShaderDebugInfo100DebugCompositeType local_a8;
  undefined4 local_a4;
  Builder *local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> memberDebugTypes;
  uint memberType;
  undefined4 uStack_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a4 = CONCAT31(in_register_00000081,isOpaqueType);
  memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar5 = (memberTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_a8 = tag;
  local_a0 = this;
  for (puVar7 = (memberTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar5; puVar7 = puVar7 + 1) {
    memberType = *puVar7;
    iVar2 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->debugTypeLocs)._M_h,&memberType);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_false>.
        _M_cur == (__node_type *)0x0) {
      __assert_fail("debugTypeLocs.find(memberType) != debugTypeLocs.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x418,
                    "Id spv::Builder::makeCompositeDebugType(const std::vector<Id> &, const char *const, const NonSemanticShaderDebugInfo100DebugCompositeType, const bool)"
                   );
    }
    pmVar3 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&memberType);
    if (*pmVar3 != 0) {
      memberType_00 = memberType;
      debugTypeLoc = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&this->debugTypeLocs,&memberType);
      local_50._M_dataplus._M_p._0_4_ = makeMemberDebugType(local_a0,memberType_00,debugTypeLoc);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&memberDebugTypes,(uint *)&local_50);
    }
  }
  this_01 = (Instruction *)::operator_new(0x60);
  this_00 = local_a0;
  IVar4 = local_a0->uniqueId + 1;
  local_a0->uniqueId = IVar4;
  IVar1 = makeVoidType(local_a0);
  this_01->_vptr_Instruction = (_func_int **)&PTR__Instruction_0089f058;
  this_01->resultId = IVar4;
  this_01->typeId = IVar1;
  this_01->opCode = OpExtInst;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_01->block = (Block *)0x0;
  type = this_01;
  Instruction::reserveOperands
            (this_01,((long)memberDebugTypes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)memberDebugTypes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) + 0xb);
  Instruction::addIdOperand(this_01,this_00->nonSemanticShaderDebugInfo);
  Instruction::addImmediateOperand(this_01,10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memberType,name,(allocator<char> *)&local_50);
  IVar1 = getStringId(this_00,(string *)&memberType);
  Instruction::addIdOperand(this_01,IVar1);
  std::__cxx11::string::_M_dispose();
  IVar1 = makeUintConstant(this_00,local_a8,false);
  Instruction::addIdOperand(this_01,IVar1);
  IVar1 = makeDebugSource(this_00,this_00->currentFileId);
  Instruction::addIdOperand(this_01,IVar1);
  IVar1 = makeUintConstant(this_00,this_00->currentLine,false);
  Instruction::addIdOperand(this_01,IVar1);
  IVar1 = makeUintConstant(this_00,0,false);
  Instruction::addIdOperand(this_01,IVar1);
  IVar1 = makeDebugCompilationUnit(this_00);
  Instruction::addIdOperand(this_01,IVar1);
  bVar6 = (byte)local_a4;
  if (bVar6 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memberType,name,(allocator<char> *)&local_50);
    IVar1 = getStringId(this_00,(string *)&memberType);
    Instruction::addIdOperand(this_01,IVar1);
    std::__cxx11::string::_M_dispose();
    IVar1 = makeUintConstant(this_00,0,false);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_b1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&memberType,
                   '@',&local_50);
    IVar1 = getStringId(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&memberType);
    Instruction::addIdOperand(this_01,IVar1);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    IVar1 = makeDebugInfoNone(this_00);
  }
  Instruction::addIdOperand(this_01,IVar1);
  IVar1 = makeUintConstant(this_00,3,false);
  Instruction::addIdOperand(this_01,IVar1);
  puVar7 = memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((bVar6 & memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish) != 0) {
    __assert_fail("isOpaqueType == false || (isOpaqueType == true && memberDebugTypes.empty())",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x437,
                  "Id spv::Builder::makeCompositeDebugType(const std::vector<Id> &, const char *const, const NonSemanticShaderDebugInfo100DebugCompositeType, const bool)"
                 );
  }
  for (; puVar5 != puVar7; puVar5 = puVar5 + 1) {
    Instruction::addIdOperand(this_01,*puVar5);
  }
  memberType = 10;
  this_02 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this_00->groupedDebugTypes,&memberType);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(this_02,&type);
  _memberType = (pointer)type;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this_00->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&memberType);
  if ((Instruction *)_memberType != (Instruction *)0x0) {
    (**(code **)(*(long *)_memberType + 8))();
  }
  Module::mapInstruction(&this_00->module,type);
  IVar1 = type->resultId;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return IVar1;
}

Assistant:

Id Builder::makeCompositeDebugType(std::vector<Id> const& memberTypes, char const*const name,
    NonSemanticShaderDebugInfo100DebugCompositeType const tag, bool const isOpaqueType)
{
    // Create the debug member types.
    std::vector<Id> memberDebugTypes;
    for(auto const memberType : memberTypes) {
        assert(debugTypeLocs.find(memberType) != debugTypeLocs.end());

        // There _should_ be debug types for all the member types but currently buffer references
        // do not have member debug info generated.
        if (debugId[memberType])
            memberDebugTypes.emplace_back(makeMemberDebugType(memberType, debugTypeLocs[memberType]));

        // TODO: Need to rethink this method of passing location information.
        // debugTypeLocs.erase(memberType);
    }

    // Create The structure debug type.
    Instruction* type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(memberDebugTypes.size() + 11);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeComposite);
    type->addIdOperand(getStringId(name)); // name id
    type->addIdOperand(makeUintConstant(tag)); // tag id
    type->addIdOperand(makeDebugSource(currentFileId)); // source id
    type->addIdOperand(makeUintConstant(currentLine)); // line id TODO: currentLine always zero?
    type->addIdOperand(makeUintConstant(0)); // TODO: column id
    type->addIdOperand(makeDebugCompilationUnit()); // scope id
    if(isOpaqueType == true) {
        // Prepend '@' to opaque types.
        type->addIdOperand(getStringId('@' + std::string(name))); // linkage name id
        type->addIdOperand(makeDebugInfoNone()); // size id
    } else {
        type->addIdOperand(getStringId(name)); // linkage name id
        type->addIdOperand(makeUintConstant(0)); // TODO: size id
    }
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsPublic)); // flags id
    assert(isOpaqueType == false || (isOpaqueType == true && memberDebugTypes.empty()));
    for(auto const memberDebugType : memberDebugTypes) {
        type->addIdOperand(memberDebugType);
    }

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeComposite].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}